

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O3

void __thiscall MacProj::check_div_cond(MacProj *this,int level,MultiFab *U_edge)

{
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  MFIter mfi;
  MultiFab dmac;
  double local_730;
  Array4<double> local_558;
  Box local_514;
  Array4<double> local_4f8;
  Array4<double> local_4b8;
  Array4<const_double> local_478;
  Array4<const_double> local_438;
  Array4<const_double> local_3f8;
  Array4<const_double> local_3b8;
  Array4<double> local_378;
  undefined1 local_338 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_328;
  int local_310;
  FabArray<amrex::FArrayBox> local_1b0;
  
  uVar1._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  local_338._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_338._8_8_ = (FabArrayBase *)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.p = (double *)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,
             (BoxArray *)
             ((long)uVar1._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x3c8),
             (DistributionMapping *)
             ((long)uVar1._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x430),1,0,
             (MFInfo *)local_338,(FabFactory<amrex::FArrayBox> *)&local_558);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_328);
  amrex::MFIter::MFIter((MFIter *)local_338,&local_1b0.super_FabArrayBase,true);
  if ((int)vStack_328.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_310) {
    do {
      amrex::MFIter::tilebox(&local_514,(MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_558,&local_1b0,(MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_4f8,&U_edge->super_FabArray<amrex::FArrayBox>,(MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_4b8,&U_edge[1].super_FabArray<amrex::FArrayBox>,(MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_378,&U_edge[2].super_FabArray<amrex::FArrayBox>,(MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_3b8,
                 (FabArray<amrex::FArrayBox> *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x540),
                 (MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_3f8,
                 (FabArray<amrex::FArrayBox> *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x6c0),
                 (MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_438,
                 (FabArray<amrex::FArrayBox> *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x840),
                 (MFIter *)local_338);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_478,
                 (FabArray<amrex::FArrayBox> *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x3c0),
                 (MFIter *)local_338);
      if (local_514.smallend.vect[2] <= local_514.bigend.vect[2]) {
        lVar7 = (long)local_514.smallend.vect[0] * 8;
        lVar13 = lVar7 + (long)local_378.begin.x * -8;
        lVar11 = lVar7 + (long)local_438.begin.x * -8;
        lVar5 = CONCAT44(local_4b8.jstride._4_4_,(undefined4)local_4b8.jstride) * 8;
        iVar10 = local_514.smallend.vect[2];
        do {
          if (local_514.smallend.vect[1] <= local_514.bigend.vect[1]) {
            lVar2 = (long)(iVar10 - local_3f8.begin.z) * local_3f8.kstride * 8 +
                    lVar7 + (long)local_3f8.begin.x * -8;
            lVar15 = (long)(iVar10 - local_4b8.begin.z) * local_4b8.kstride * 8 +
                     lVar7 + (long)local_4b8.begin.x * -8;
            lVar14 = (long)local_514.smallend.vect[1];
            do {
              if (local_514.smallend.vect[0] <= local_514.bigend.vect[0]) {
                lVar3 = (lVar14 - local_3b8.begin.y) * local_3b8.jstride * 8 +
                        (long)(iVar10 - local_3b8.begin.z) * local_3b8.kstride * 8 +
                        lVar7 + (long)local_3b8.begin.x * -8;
                lVar6 = (lVar14 - local_4f8.begin.y) *
                        CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 8 +
                        (long)(iVar10 - local_4f8.begin.z) *
                        CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 8 +
                        lVar7 + (long)local_4f8.begin.x * -8 +
                        CONCAT44(local_4f8.p._4_4_,(int)local_4f8.p);
                lVar8 = (lVar14 - local_438.begin.y) * local_438.jstride * 8;
                lVar12 = (lVar14 - local_378.begin.y) * local_378.jstride * 8;
                lVar4 = (lVar14 - local_558.begin.y) * local_558.jstride * 8 +
                        (long)(iVar10 - local_558.begin.z) * local_558.kstride * 8 +
                        lVar7 + (long)local_558.begin.x * -8;
                lVar9 = 0;
                do {
                  dVar16 = (*(double *)
                             ((long)local_438.p +
                             lVar9 * 8 +
                             lVar8 + (long)((iVar10 + 1) - local_438.begin.z) *
                                     local_438.kstride * 8 + lVar11) *
                            *(double *)
                             ((long)local_378.p +
                             lVar9 * 8 +
                             lVar12 + (long)((iVar10 + 1) - local_378.begin.z) *
                                      local_378.kstride * 8 + lVar13) +
                           ((*(double *)
                              ((long)local_3f8.p +
                              lVar9 * 8 +
                              ((lVar14 + 1) - (long)local_3f8.begin.y) * local_3f8.jstride * 8 +
                              lVar2) * *(double *)
                                        ((long)local_4b8.p +
                                        lVar9 * 8 +
                                        ((lVar14 + 1) - (long)local_4b8.begin.y) * lVar5 + lVar15) +
                            (*(double *)((long)local_3b8.p + lVar9 * 8 + lVar3 + 8) *
                             *(double *)(lVar6 + 8 + lVar9 * 8) -
                            *(double *)(lVar6 + lVar9 * 8) *
                            *(double *)((long)local_3b8.p + lVar9 * 8 + lVar3))) -
                           *(double *)
                            ((long)local_3f8.p +
                            lVar9 * 8 + (lVar14 - local_3f8.begin.y) * local_3f8.jstride * 8 + lVar2
                            ) * *(double *)
                                 ((long)local_4b8.p +
                                 lVar9 * 8 + (lVar14 - local_4b8.begin.y) * lVar5 + lVar15))) -
                           *(double *)
                            ((long)local_438.p +
                            lVar9 * 8 +
                            lVar8 + (long)(iVar10 - local_438.begin.z) * local_438.kstride * 8 +
                                    lVar11) *
                           *(double *)
                            ((long)local_378.p +
                            lVar9 * 8 +
                            lVar12 + (long)(iVar10 - local_378.begin.z) * local_378.kstride * 8 +
                                     lVar13);
                  *(double *)((long)local_558.p + lVar9 * 8 + lVar4) = dVar16;
                  *(double *)((long)local_558.p + lVar9 * 8 + lVar4) =
                       dVar16 / *(double *)
                                 ((long)local_478.p +
                                 lVar9 * 8 +
                                 (lVar14 - local_478.begin.y) * local_478.jstride * 8 +
                                 (long)(iVar10 - local_478.begin.z) * local_478.kstride * 8 +
                                 lVar7 + (long)local_478.begin.x * -8);
                  lVar9 = lVar9 + 1;
                } while ((local_514.bigend.vect[0] - local_514.smallend.vect[0]) + 1 != (int)lVar9);
              }
              lVar14 = lVar14 + 1;
            } while (local_514.bigend.vect[1] + 1 != (int)lVar14);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != local_514.bigend.vect[2] + 1);
      }
      amrex::MFIter::operator++((MFIter *)local_338);
    } while ((int)vStack_328.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_310);
  }
  amrex::MFIter::~MFIter((MFIter *)local_338);
  local_4b8.p = (double *)0x0;
  local_4b8.jstride._0_4_ = 0;
  amrex::MFIter::MFIter((MFIter *)local_338,&local_1b0.super_FabArrayBase,true);
  local_730 = 0.0;
  if ((int)vStack_328.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_310) {
    local_730 = 0.0;
    do {
      amrex::MFIter::growntilebox((Box *)&local_4f8,(MFIter *)local_338,(IntVect *)&local_4b8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_558,&local_1b0,(MFIter *)local_338);
      lVar5 = (long)(int)local_4f8.jstride;
      dVar16 = 0.0;
      if ((int)local_4f8.jstride <= local_4f8.kstride._4_4_) {
        lVar7 = ((long)local_4f8.p._4_4_ - (long)local_558.begin.y) * local_558.jstride * 8 +
                (lVar5 - local_558.begin.z) * local_558.kstride * 8 + (long)(int)local_4f8.p * 8 +
                (long)local_558.begin.x * -8 + (long)local_558.p;
        do {
          lVar11 = lVar7;
          lVar13 = (long)local_4f8.p._4_4_;
          if (local_4f8.p._4_4_ <= (int)local_4f8.kstride) {
            do {
              if ((int)local_4f8.p <= local_4f8.jstride._4_4_) {
                lVar15 = 0;
                do {
                  dVar16 = dVar16 + *(double *)(lVar11 + lVar15 * 8);
                  lVar15 = lVar15 + 1;
                } while ((local_4f8.jstride._4_4_ - (int)local_4f8.p) + 1 != (int)lVar15);
              }
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + local_558.jstride * 8;
            } while ((int)local_4f8.kstride + 1 != (int)lVar13);
          }
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + local_558.kstride * 8;
        } while (local_4f8.kstride._4_4_ + 1 != (int)lVar5);
      }
      local_730 = local_730 + dVar16;
      amrex::MFIter::operator++((MFIter *)local_338);
    } while ((int)vStack_328.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_310);
  }
  amrex::MFIter::~MFIter((MFIter *)local_338);
  if (verbose != 0) {
    local_338._8_8_ = amrex::OutStream();
    local_338._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_338._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_328);
    *(undefined8 *)
     ((long)&vStack_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     vStack_328.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((*(_func_int ***)local_338._8_8_)[-3] + (long)&((BoxArray *)(local_338._8_8_ + 8))->m_bat
          );
    *(undefined8 *)
     ((long)&vStack_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     vStack_328.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_328,"SUM of DIV(U_edge) = ",0x15);
    std::ostream::_M_insert<double>(local_730);
    local_558.p = (double *)CONCAT71(local_558.p._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_328,(char *)&local_558,1);
    amrex::Print::~Print((Print *)local_338);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
MacProj::check_div_cond (int      level,
                         MultiFab U_edge[]) const
{
    const NavierStokesBase& ns_level = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab& volume       = ns_level.Volume();
    const MultiFab* area         = ns_level.Area();

    MultiFab dmac(volume.boxArray(),volume.DistributionMap(),1,0);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dmac,TilingIfNotGPU());mfi.isValid();++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cc_divu   = dmac.array(mfi);
        D_TERM(auto const& ux_e = U_edge[0].array(mfi);,
               auto const& uy_e = U_edge[1].array(mfi);,
               auto const& uz_e = U_edge[2].array(mfi););
        D_TERM(auto const& xarea  = area[0].array(mfi);,
               auto const& yarea  = area[1].array(mfi);,
               auto const& zarea  = area[2].array(mfi););
        auto const& vol       = volume.array(mfi);

        amrex::ParallelFor(bx, [cc_divu,D_DECL(ux_e,uy_e,uz_e),
                                        D_DECL(xarea,yarea,zarea), vol]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            cc_divu(i,j,k) = D_TERM(  xarea(i+1,j,k)*ux_e(i+1,j,k) - xarea(i,j,k)*ux_e(i,j,k),
                                    + yarea(i,j+1,k)*uy_e(i,j+1,k) - yarea(i,j,k)*uy_e(i,j,k),
                                    + zarea(i,j,k+1)*uz_e(i,j,k+1) - zarea(i,j,k)*uz_e(i,j,k));
            cc_divu(i,j,k) /= vol(i,j,k);
        });
    }

    Real sm = amrex::ReduceSum(dmac, 0, []
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dmac_arr) -> Real
    {
        Real tmp = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            tmp += dmac_arr(i,j,k);
        });
        return tmp;
    });

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealSum(sm,IOProc);

        amrex::Print().SetPrecision(15) << "SUM of DIV(U_edge) = " << sm << '\n';
    }
}